

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O3

void __thiscall
Assimp::X3DImporter::XML_ReadNode_GetAttrVal_AsArrVec3f
          (X3DImporter *this,int pAttrIdx,
          vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pValue)

{
  pointer *ppaVar1;
  iterator __position;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  _Node_conflict3 *__tmp;
  list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tlist;
  _List_node_base local_30;
  size_type local_20;
  
  local_20 = 0;
  local_30._M_next = &local_30;
  local_30._M_prev = &local_30;
  XML_ReadNode_GetAttrVal_AsListVec3f
            (this,pAttrIdx,(list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&local_30
            );
  p_Var3 = local_30._M_next;
  if (local_30._M_next != &local_30) {
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve(pValue,local_20);
    for (p_Var2 = local_30._M_next; p_Var3 = local_30._M_next, p_Var2 != &local_30;
        p_Var2 = (((_List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                  &p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
      __position._M_current =
           (pValue->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (pValue->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
        _M_realloc_insert<aiVector3t<float>const&>
                  ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)pValue,__position,
                   (aiVector3t<float> *)(p_Var2 + 1));
      }
      else {
        (__position._M_current)->z = *(float *)&p_Var2[1]._M_prev;
        *(_List_node_base **)__position._M_current = p_Var2[1]._M_next;
        ppaVar1 = &(pValue->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppaVar1 = *ppaVar1 + 1;
      }
    }
  }
  while (p_Var3 != &local_30) {
    p_Var2 = p_Var3->_M_next;
    operator_delete(p_Var3,0x20);
    p_Var3 = p_Var2;
  }
  return;
}

Assistant:

void X3DImporter::XML_ReadNode_GetAttrVal_AsArrVec3f(const int pAttrIdx, std::vector<aiVector3D>& pValue)
{
    std::list<aiVector3D> tlist;

	XML_ReadNode_GetAttrVal_AsListVec3f(pAttrIdx, tlist);// read as list
	// and copy to array
	if(!tlist.empty())
	{
		pValue.reserve(tlist.size());
        for ( std::list<aiVector3D>::iterator it = tlist.begin(); it != tlist.end(); ++it )
        {
            pValue.push_back( *it );
        }
	}
}